

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decay.c
# Opt level: O2

_Bool duckdb_je_decay_ms_valid(ssize_t decay_ms)

{
  return decay_ms + 1U < 0x10c6f7a0af42;
}

Assistant:

bool
decay_ms_valid(ssize_t decay_ms) {
	if (decay_ms < -1) {
		return false;
	}
	if (decay_ms == -1 || (uint64_t)decay_ms <= NSTIME_SEC_MAX *
	    KQU(1000)) {
		return true;
	}
	return false;
}